

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O0

void __thiscall
slang::ast::ReplicatedAssignmentPatternExpression::visitExprs<netlist::VariableReferenceVisitor&>
          (ReplicatedAssignmentPatternExpression *this,VariableReferenceVisitor *visitor)

{
  Expression *in_RSI;
  VariableReferenceVisitor *in_RDI;
  VariableReferenceVisitor *in_stack_00000018;
  AssignmentPatternExpressionBase *in_stack_00000020;
  
  count((ReplicatedAssignmentPatternExpression *)in_RDI);
  Expression::visit<netlist::VariableReferenceVisitor&>(in_RSI,in_RDI);
  AssignmentPatternExpressionBase::visitExprs<netlist::VariableReferenceVisitor&>
            (in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        count().visit(visitor);
        AssignmentPatternExpressionBase::visitExprs(visitor);
    }